

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteKvIoPageUnRef(unqlite_page *pPage)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  Pager *pPager;
  Page *pPVar4;
  Page **ppPVar5;
  Page **ppPVar6;
  int iVar7;
  
  if (pPage == (unqlite_page *)0x0) {
    return 0;
  }
  lVar2 = **(long **)pPage[1].zData;
  if ((lVar2 == 0) || ((*(long **)pPage[1].zData)[6] == 0)) {
    iVar7 = *(int *)((long)&pPage[1].pUserData + 4);
    *(int *)((long)&pPage[1].pUserData + 4) = iVar7 + -1;
  }
  else {
    (**(code **)(lVar2 + 0x20))();
    plVar3 = *(long **)pPage[1].zData;
    lVar2 = *plVar3;
    iVar7 = *(int *)((long)&pPage[1].pUserData + 4);
    *(int *)((long)&pPage[1].pUserData + 4) = iVar7 + -1;
    if ((lVar2 != 0) && (plVar3[6] != 0)) {
      (**(code **)(lVar2 + 0x30))();
    }
  }
  if (iVar7 != 0) {
    return 0;
  }
  pPager = (Pager *)pPage[1].zData;
  uVar1 = *(uint *)&pPage[1].pUserData;
  if ((uVar1 & 2) == 0) {
    pager_unlink_page(pPager,(Page *)pPage);
    pager_release_page(pPager,(Page *)pPage);
    return 0;
  }
  if ((uVar1 & 0xc0) != 0) {
    return 0;
  }
  pPage[4].zData = (uchar *)0x0;
  ppPVar6 = &pPager->pHotDirty;
  if (pPager->pFirstHot == (Page *)0x0) {
    ppPVar5 = &pPager->pFirstHot;
  }
  else {
    pPVar4 = *ppPVar6;
    pPage[3].iPage = (pgno)pPVar4;
    ppPVar5 = ppPVar6;
    if (pPVar4 == (Page *)0x0) goto LAB_001160a0;
    ppPVar6 = &pPVar4->pPrevHot;
  }
  *ppPVar6 = (Page *)pPage;
LAB_001160a0:
  *ppPVar5 = (Page *)pPage;
  pPager->nHot = pPager->nHot + 1;
  *(uint *)&pPage[1].pUserData = uVar1 | 0x40;
  return 0;
}

Assistant:

static int unqliteKvIoPageUnRef(unqlite_page *pPage)
{
	if( pPage ){
		page_unref((Page *)pPage);
	}
	return UNQLITE_OK;
}